

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O3

void __thiscall
slang::ast::StructuredAssignmentPatternExpression::serializeTo
          (StructuredAssignmentPatternExpression *this,ASTSerializer *serializer)

{
  size_t sVar1;
  MemberSetter *setter;
  pointer pMVar2;
  pointer pTVar3;
  pointer pIVar4;
  IndexSetter *setter_2;
  pointer pMVar5;
  pointer pTVar6;
  pointer pIVar7;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  
  if (this->defaultSetter != (Expression *)0x0) {
    ASTSerializer::write(serializer,0xd,"defaultSetter",(size_t)this->defaultSetter);
  }
  if ((this->memberSetters)._M_extent._M_extent_value != 0) {
    name._M_str = "memberSetters";
    name._M_len = 0xd;
    ASTSerializer::startArray(serializer,name);
    sVar1 = (this->memberSetters)._M_extent._M_extent_value;
    if (sVar1 != 0) {
      pMVar2 = (this->memberSetters)._M_ptr;
      pMVar5 = pMVar2 + sVar1;
      do {
        ASTSerializer::startObject(serializer);
        name_00._M_str = "member";
        name_00._M_len = 6;
        ASTSerializer::writeLink(serializer,name_00,(pMVar2->member).ptr);
        ASTSerializer::write(serializer,4,"expr",(size_t)(pMVar2->expr).ptr);
        ASTSerializer::endObject(serializer);
        pMVar2 = pMVar2 + 1;
      } while (pMVar2 != pMVar5);
    }
    ASTSerializer::endArray(serializer);
  }
  if ((this->typeSetters)._M_extent._M_extent_value != 0) {
    name_01._M_str = "typeSetters";
    name_01._M_len = 0xb;
    ASTSerializer::startArray(serializer,name_01);
    sVar1 = (this->typeSetters)._M_extent._M_extent_value;
    if (sVar1 != 0) {
      pTVar3 = (this->typeSetters)._M_ptr;
      pTVar6 = pTVar3 + sVar1;
      do {
        ASTSerializer::startObject(serializer);
        ASTSerializer::write(serializer,4,"type",(size_t)(pTVar3->type).ptr);
        ASTSerializer::write(serializer,4,"expr",(size_t)(pTVar3->expr).ptr);
        ASTSerializer::endObject(serializer);
        pTVar3 = pTVar3 + 1;
      } while (pTVar3 != pTVar6);
    }
    ASTSerializer::endArray(serializer);
  }
  if ((this->indexSetters)._M_extent._M_extent_value != 0) {
    name_02._M_str = "indexSetters";
    name_02._M_len = 0xc;
    ASTSerializer::startArray(serializer,name_02);
    sVar1 = (this->indexSetters)._M_extent._M_extent_value;
    if (sVar1 != 0) {
      pIVar7 = (this->indexSetters)._M_ptr;
      pIVar4 = pIVar7 + sVar1;
      do {
        ASTSerializer::startObject(serializer);
        ASTSerializer::write(serializer,5,"index",(size_t)(pIVar7->index).ptr);
        ASTSerializer::write(serializer,4,"expr",(size_t)(pIVar7->expr).ptr);
        ASTSerializer::endObject(serializer);
        pIVar7 = pIVar7 + 1;
      } while (pIVar7 != pIVar4);
    }
    ASTSerializer::endArray(serializer);
    return;
  }
  return;
}

Assistant:

void StructuredAssignmentPatternExpression::serializeTo(ASTSerializer& serializer) const {
    if (defaultSetter)
        serializer.write("defaultSetter", *defaultSetter);

    if (!memberSetters.empty()) {
        serializer.startArray("memberSetters");
        for (auto& setter : memberSetters) {
            serializer.startObject();
            serializer.writeLink("member", *setter.member);
            serializer.write("expr", *setter.expr);
            serializer.endObject();
        }
        serializer.endArray();
    }

    if (!typeSetters.empty()) {
        serializer.startArray("typeSetters");
        for (auto& setter : typeSetters) {
            serializer.startObject();
            serializer.write("type", *setter.type);
            serializer.write("expr", *setter.expr);
            serializer.endObject();
        }
        serializer.endArray();
    }

    if (!indexSetters.empty()) {
        serializer.startArray("indexSetters");
        for (auto& setter : indexSetters) {
            serializer.startObject();
            serializer.write("index", *setter.index);
            serializer.write("expr", *setter.expr);
            serializer.endObject();
        }
        serializer.endArray();
    }
}